

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O0

void tnt_schema_sval_free(tnt_schema_sval *val)

{
  tnt_schema_sval *val_local;
  
  if ((val != (tnt_schema_sval *)0x0) && (tnt_mem_free(val->name), val->index != (mh_assoc_t *)0x0))
  {
    tnt_schema_index_free(val->index);
    mh_assoc_delete(val->index);
  }
  tnt_mem_free(val);
  return;
}

Assistant:

static inline void
tnt_schema_sval_free(struct tnt_schema_sval *val) {
	if (val) {
		tnt_mem_free(val->name);
		if (val->index) {
			tnt_schema_index_free(val->index);
			mh_assoc_delete(val->index);
		}
	}
	tnt_mem_free(val);
}